

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *elem,xmlChar *name,xmlChar *ns,
                   xmlAttributeType type,xmlAttributeDefault def,xmlChar *defaultValue,
                   xmlEnumerationPtr tree)

{
  xmlDocPtr doc;
  _xmlDoc *p_Var1;
  _xmlEnumeration *p_Var2;
  _xmlNode *p_Var3;
  xmlAttributePtr pxVar4;
  int iVar5;
  xmlHashTablePtr pxVar6;
  xmlAttributePtr attr;
  xmlChar *pxVar7;
  void *pvVar8;
  xmlElementPtr elem_00;
  xmlAttributePtr pxVar9;
  xmlAttributePtr *ppxVar10;
  xmlDictPtr local_50;
  xmlChar *local_40;
  
  if (dtd == (xmlDtdPtr)0x0) {
    if (tree == (xmlEnumerationPtr)0x0) {
      return (xmlAttributePtr)0x0;
    }
    do {
      p_Var2 = tree->next;
      (*xmlFree)(tree->name);
      (*xmlFree)(tree);
      tree = p_Var2;
    } while (p_Var2 != (_xmlEnumeration *)0x0);
    return (xmlAttributePtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    if (tree == (xmlEnumerationPtr)0x0) {
      return (xmlAttributePtr)0x0;
    }
    do {
      p_Var2 = tree->next;
      (*xmlFree)(tree->name);
      (*xmlFree)(tree);
      tree = p_Var2;
    } while (p_Var2 != (_xmlEnumeration *)0x0);
    return (xmlAttributePtr)0x0;
  }
  if (elem == (xmlChar *)0x0) {
    if (tree == (xmlEnumerationPtr)0x0) {
      return (xmlAttributePtr)0x0;
    }
    do {
      p_Var2 = tree->next;
      (*xmlFree)(tree->name);
      (*xmlFree)(tree);
      tree = p_Var2;
    } while (p_Var2 != (_xmlEnumeration *)0x0);
    return (xmlAttributePtr)0x0;
  }
  doc = dtd->doc;
  if (doc == (xmlDocPtr)0x0) {
    local_50 = (xmlDictPtr)0x0;
  }
  else {
    local_50 = doc->dict;
  }
  if (9 < type - XML_ATTRIBUTE_CDATA) {
    xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_ERR_ARGUMENT,2,(xmlChar *)0x0,(xmlChar *)0x0,
                  (xmlChar *)0x0,0,"xmlAddAttributeDecl: invalid type\n",0);
    if (tree == (xmlEnumerationPtr)0x0) {
      return (xmlAttributePtr)0x0;
    }
    do {
      p_Var2 = tree->next;
      (*xmlFree)(tree->name);
      (*xmlFree)(tree);
      tree = p_Var2;
    } while (p_Var2 != (_xmlEnumeration *)0x0);
    return (xmlAttributePtr)0x0;
  }
  if (defaultValue == (xmlChar *)0x0) {
LAB_00157b4c:
    local_40 = (xmlChar *)0x0;
  }
  else {
    iVar5 = xmlValidateAttributeValueInternal(doc,type,defaultValue);
    if (iVar5 == 0) {
      xmlDoErrValid(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_DEFAULT,2,elem,name,defaultValue,0,
                    "Attribute %s of %s: invalid default value\n",elem,name,defaultValue);
      if (ctxt != (xmlValidCtxtPtr)0x0) {
        ctxt->valid = 0;
      }
      goto LAB_00157b4c;
    }
    local_40 = defaultValue;
  }
  p_Var1 = dtd->doc;
  if ((((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->extSubset == dtd)) &&
      (p_Var1->intSubset != (_xmlDtd *)0x0)) &&
     ((pxVar6 = (xmlHashTablePtr)p_Var1->intSubset->attributes, pxVar6 != (xmlHashTablePtr)0x0 &&
      (pvVar8 = xmlHashLookup3(pxVar6,name,ns,elem), pvVar8 != (void *)0x0)))) {
    if (tree == (xmlEnumerationPtr)0x0) {
      return (xmlAttributePtr)0x0;
    }
    do {
      p_Var2 = tree->next;
      (*xmlFree)(tree->name);
      (*xmlFree)(tree);
      tree = p_Var2;
    } while (p_Var2 != (_xmlEnumeration *)0x0);
    return (xmlAttributePtr)0x0;
  }
  pxVar6 = (xmlHashTablePtr)dtd->attributes;
  if (pxVar6 == (xmlHashTablePtr)0x0) {
    pxVar6 = xmlHashCreateDict(0,local_50);
    dtd->attributes = pxVar6;
  }
  if ((pxVar6 == (xmlHashTablePtr)0x0) ||
     (attr = (xmlAttributePtr)(*xmlMalloc)(0x78), attr == (xmlAttributePtr)0x0)) {
    attr = (xmlAttributePtr)0x0;
  }
  else {
    attr->_private = (void *)0x0;
    *(undefined8 *)&attr->type = 0;
    attr->atype = 0;
    attr->def = 0;
    attr->defaultValue = (xmlChar *)0x0;
    attr->tree = (xmlEnumerationPtr)0x0;
    attr->prefix = (xmlChar *)0x0;
    attr->doc = (_xmlDoc *)0x0;
    attr->nexth = (_xmlAttribute *)0x0;
    attr->next = (_xmlNode *)0x0;
    attr->prev = (_xmlNode *)0x0;
    attr->last = (_xmlNode *)0x0;
    attr->parent = (_xmlDtd *)0x0;
    attr->name = (xmlChar *)0x0;
    attr->children = (_xmlNode *)0x0;
    attr->elem = (xmlChar *)0x0;
    attr->type = XML_ATTRIBUTE_DECL;
    attr->atype = type;
    attr->doc = dtd->doc;
    if (local_50 == (xmlDictPtr)0x0) {
      pxVar7 = xmlStrdup(name);
      attr->name = pxVar7;
      pxVar7 = xmlStrdup(elem);
    }
    else {
      pxVar7 = xmlDictLookup(local_50,name,-1);
      attr->name = pxVar7;
      pxVar7 = xmlDictLookup(local_50,elem,-1);
    }
    attr->elem = pxVar7;
    if ((attr->name != (xmlChar *)0x0) && (attr->elem != (xmlChar *)0x0)) {
      if (ns != (xmlChar *)0x0) {
        if (local_50 == (xmlDictPtr)0x0) {
          pxVar7 = xmlStrdup(ns);
        }
        else {
          pxVar7 = xmlDictLookup(local_50,ns,-1);
        }
        attr->prefix = pxVar7;
        if (pxVar7 == (xmlChar *)0x0) goto LAB_00157c21;
      }
      attr->def = def;
      attr->tree = tree;
      if (local_40 == (xmlChar *)0x0) {
LAB_00157d67:
        elem_00 = xmlGetDtdElementDesc2(ctxt,dtd,elem);
        if (elem_00 != (xmlElementPtr)0x0) {
          iVar5 = xmlHashAdd3(pxVar6,attr->name,attr->prefix,attr->elem,attr);
          if (0 < iVar5) {
            if (((type == XML_ATTRIBUTE_ID) &&
                (iVar5 = xmlScanIDAttributeDecl(ctxt,elem_00,1), iVar5 != 0)) &&
               (xmlDoErrValid(ctxt,(xmlNodePtr)dtd,XML_DTD_MULTIPLE_ID,2,elem,name,(xmlChar *)0x0,0,
                              "Element %s has too may ID attributes defined : %s\n",elem,name,0),
               ctxt != (xmlValidCtxtPtr)0x0)) {
              ctxt->valid = 0;
            }
            iVar5 = xmlStrEqual(attr->name,"xmlns");
            if ((iVar5 == 0) &&
               ((attr->prefix == (xmlChar *)0x0 ||
                (iVar5 = xmlStrEqual(attr->prefix,"xmlns"), iVar5 == 0)))) {
              ppxVar10 = &elem_00->attributes;
              pxVar4 = elem_00->attributes;
              do {
                pxVar9 = pxVar4;
                if (pxVar9 == (xmlAttributePtr)0x0) goto LAB_00157e2a;
                iVar5 = xmlStrEqual(pxVar9->name,"xmlns");
              } while (((iVar5 != 0) ||
                       ((attr->prefix != (xmlChar *)0x0 &&
                        (iVar5 = xmlStrEqual(attr->prefix,"xmlns"), iVar5 != 0)))) &&
                      (pxVar4 = pxVar9->nexth, pxVar9->nexth != (_xmlAttribute *)0x0));
              ppxVar10 = &pxVar9->nexth;
            }
            else {
              ppxVar10 = &elem_00->attributes;
            }
LAB_00157e2a:
            attr->nexth = *ppxVar10;
            *ppxVar10 = attr;
            attr->parent = dtd;
            p_Var3 = dtd->last;
            if (p_Var3 != (_xmlNode *)0x0) {
              p_Var3->next = (_xmlNode *)attr;
              attr->prev = p_Var3;
              dtd->last = (_xmlNode *)attr;
              return attr;
            }
            dtd->last = (_xmlNode *)attr;
            dtd->children = (_xmlNode *)attr;
            return attr;
          }
          if (-1 < iVar5) {
            xmlDoErrValid(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_REDEFINED,1,name,elem,
                          (xmlChar *)0x0,0,"Attribute %s of element %s: already defined\n",name,elem
                          ,0);
            goto LAB_00157c4f;
          }
        }
      }
      else {
        if (local_50 == (xmlDictPtr)0x0) {
          pxVar7 = xmlStrdup(local_40);
        }
        else {
          pxVar7 = xmlDictLookup(local_50,local_40,-1);
        }
        attr->defaultValue = pxVar7;
        if (pxVar7 != (xmlChar *)0x0) goto LAB_00157d67;
      }
      tree = (xmlEnumerationPtr)0x0;
    }
  }
LAB_00157c21:
  xmlVErrMemory(ctxt);
  while (tree != (xmlEnumerationPtr)0x0) {
    p_Var2 = tree->next;
    (*xmlFree)(tree->name);
    (*xmlFree)(tree);
    tree = p_Var2;
  }
LAB_00157c4f:
  xmlFreeAttribute(attr);
  return (xmlAttributePtr)0x0;
}

Assistant:

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,
                    xmlDtdPtr dtd, const xmlChar *elem,
                    const xmlChar *name, const xmlChar *ns,
		    xmlAttributeType type, xmlAttributeDefault def,
		    const xmlChar *defaultValue, xmlEnumerationPtr tree) {
    xmlAttributePtr ret = NULL;
    xmlAttributeTablePtr table;
    xmlElementPtr elemDef;
    xmlDictPtr dict = NULL;
    int res;

    if (dtd == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (name == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (elem == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (dtd->doc != NULL)
	dict = dtd->doc->dict;

#ifdef LIBXML_VALID_ENABLED
    /*
     * Check the type and possibly the default value.
     */
    switch (type) {
        case XML_ATTRIBUTE_CDATA:
	    break;
        case XML_ATTRIBUTE_ID:
	    break;
        case XML_ATTRIBUTE_IDREF:
	    break;
        case XML_ATTRIBUTE_IDREFS:
	    break;
        case XML_ATTRIBUTE_ENTITY:
	    break;
        case XML_ATTRIBUTE_ENTITIES:
	    break;
        case XML_ATTRIBUTE_NMTOKEN:
	    break;
        case XML_ATTRIBUTE_NMTOKENS:
	    break;
        case XML_ATTRIBUTE_ENUMERATION:
	    break;
        case XML_ATTRIBUTE_NOTATION:
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_ARGUMENT,
		    "xmlAddAttributeDecl: invalid type\n", NULL);
	    xmlFreeEnumeration(tree);
	    return(NULL);
    }
    if ((defaultValue != NULL) &&
        (!xmlValidateAttributeValueInternal(dtd->doc, type, defaultValue))) {
	xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_DEFAULT,
	                "Attribute %s of %s: invalid default value\n",
	                elem, name, defaultValue);
	defaultValue = NULL;
	if (ctxt != NULL)
	    ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check first that an attribute defined in the external subset wasn't
     * already defined in the internal subset
     */
    if ((dtd->doc != NULL) && (dtd->doc->extSubset == dtd) &&
	(dtd->doc->intSubset != NULL) &&
	(dtd->doc->intSubset->attributes != NULL)) {
        ret = xmlHashLookup3(dtd->doc->intSubset->attributes, name, ns, elem);
	if (ret != NULL) {
	    xmlFreeEnumeration(tree);
	    return(NULL);
	}
    }

    /*
     * Create the Attribute table if needed.
     */
    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL) {
        table = xmlHashCreateDict(0, dict);
	dtd->attributes = (void *) table;
    }
    if (table == NULL)
        goto mem_error;

    ret = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (ret == NULL)
        goto mem_error;
    memset(ret, 0, sizeof(xmlAttribute));
    ret->type = XML_ATTRIBUTE_DECL;

    /*
     * fill the structure.
     */
    ret->atype = type;
    /*
     * doc must be set before possible error causes call
     * to xmlFreeAttribute (because it's used to check on
     * dict use)
     */
    ret->doc = dtd->doc;
    if (dict) {
	ret->name = xmlDictLookup(dict, name, -1);
	ret->elem = xmlDictLookup(dict, elem, -1);
    } else {
	ret->name = xmlStrdup(name);
	ret->elem = xmlStrdup(elem);
    }
    if ((ret->name == NULL) || (ret->elem == NULL))
        goto mem_error;
    if (ns != NULL) {
        if (dict)
            ret->prefix = xmlDictLookup(dict, ns, -1);
        else
            ret->prefix = xmlStrdup(ns);
        if (ret->prefix == NULL)
            goto mem_error;
    }
    ret->def = def;
    ret->tree = tree;
    tree = NULL;
    if (defaultValue != NULL) {
        if (dict)
	    ret->defaultValue = xmlDictLookup(dict, defaultValue, -1);
	else
	    ret->defaultValue = xmlStrdup(defaultValue);
        if (ret->defaultValue == NULL)
            goto mem_error;
    }

    elemDef = xmlGetDtdElementDesc2(ctxt, dtd, elem);
    if (elemDef == NULL)
        goto mem_error;

    /*
     * Validity Check:
     * Search the DTD for previous declarations of the ATTLIST
     */
    res = xmlHashAdd3(table, ret->name, ret->prefix, ret->elem, ret);
    if (res <= 0) {
        if (res < 0)
            goto mem_error;
#ifdef LIBXML_VALID_ENABLED
        /*
         * The attribute is already defined in this DTD.
         */
        xmlErrValidWarning(ctxt, (xmlNodePtr) dtd,
                XML_DTD_ATTRIBUTE_REDEFINED,
                "Attribute %s of element %s: already defined\n",
                name, elem, NULL);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeAttribute(ret);
	return(NULL);
    }

    /*
     * Validity Check:
     * Multiple ID per element
     */
#ifdef LIBXML_VALID_ENABLED
    if ((type == XML_ATTRIBUTE_ID) &&
        (xmlScanIDAttributeDecl(ctxt, elemDef, 1) != 0)) {
        xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_MULTIPLE_ID,
       "Element %s has too may ID attributes defined : %s\n",
               elem, name, NULL);
        if (ctxt != NULL)
            ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Insert namespace default def first they need to be
     * processed first.
     */
    if ((xmlStrEqual(ret->name, BAD_CAST "xmlns")) ||
        ((ret->prefix != NULL &&
         (xmlStrEqual(ret->prefix, BAD_CAST "xmlns"))))) {
        ret->nexth = elemDef->attributes;
        elemDef->attributes = ret;
    } else {
        xmlAttributePtr tmp = elemDef->attributes;

        while ((tmp != NULL) &&
               ((xmlStrEqual(tmp->name, BAD_CAST "xmlns")) ||
                ((ret->prefix != NULL &&
                 (xmlStrEqual(ret->prefix, BAD_CAST "xmlns")))))) {
            if (tmp->nexth == NULL)
                break;
            tmp = tmp->nexth;
        }
        if (tmp != NULL) {
            ret->nexth = tmp->nexth;
            tmp->nexth = ret;
        } else {
            ret->nexth = elemDef->attributes;
            elemDef->attributes = ret;
        }
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFreeEnumeration(tree);
    xmlFreeAttribute(ret);
    return(NULL);
}